

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int amqpvalue_get_sasl_response(AMQP_VALUE value,SASL_RESPONSE_HANDLE *sasl_response_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  undefined1 local_50 [8];
  amqp_binary response;
  AMQP_VALUE item_value;
  AMQP_VALUE pAStack_30;
  uint32_t list_item_count;
  AMQP_VALUE list_value;
  SASL_RESPONSE_INSTANCE *sasl_response_instance;
  SASL_RESPONSE_HANDLE *ppSStack_18;
  int result;
  SASL_RESPONSE_HANDLE *sasl_response_handle_local;
  AMQP_VALUE value_local;
  
  ppSStack_18 = sasl_response_handle;
  sasl_response_handle_local = (SASL_RESPONSE_HANDLE *)value;
  list_value = (AMQP_VALUE)sasl_response_create_internal();
  *ppSStack_18 = (SASL_RESPONSE_HANDLE)list_value;
  if (*ppSStack_18 == (SASL_RESPONSE_HANDLE)0x0) {
    sasl_response_instance._4_4_ = 0x2c65;
  }
  else {
    pAStack_30 = amqpvalue_get_inplace_described_value((AMQP_VALUE)sasl_response_handle_local);
    if (pAStack_30 == (AMQP_VALUE)0x0) {
      sasl_response_destroy(*ppSStack_18);
      sasl_response_instance._4_4_ = 0x2c6d;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAStack_30,(uint32_t *)((long)&item_value + 4));
      if (iVar1 == 0) {
        if (item_value._4_4_ == 0) {
          sasl_response_instance._4_4_ = 0x2ca1;
        }
        else {
          response._8_8_ = amqpvalue_get_list_item(pAStack_30,0);
          if ((AMQP_VALUE)response._8_8_ == (AMQP_VALUE)0x0) {
            sasl_response_destroy(*ppSStack_18);
            sasl_response_instance._4_4_ = 0x2c83;
          }
          else {
            AVar2 = amqpvalue_get_type((AMQP_VALUE)response._8_8_);
            if (AVar2 == AMQP_TYPE_NULL) {
              amqpvalue_destroy((AMQP_VALUE)response._8_8_);
              sasl_response_destroy(*ppSStack_18);
              sasl_response_instance._4_4_ = 0x2c8d;
            }
            else {
              iVar1 = amqpvalue_get_binary((AMQP_VALUE)response._8_8_,(amqp_binary *)local_50);
              if (iVar1 == 0) {
                amqpvalue_destroy((AMQP_VALUE)response._8_8_);
                pAVar3 = amqpvalue_clone((AMQP_VALUE)sasl_response_handle_local);
                *(AMQP_VALUE *)list_value = pAVar3;
                sasl_response_instance._4_4_ = 0;
              }
              else {
                amqpvalue_destroy((AMQP_VALUE)response._8_8_);
                sasl_response_destroy(*ppSStack_18);
                sasl_response_instance._4_4_ = 0x2c97;
              }
            }
          }
        }
      }
      else {
        sasl_response_instance._4_4_ = 0x2c74;
      }
    }
  }
  return sasl_response_instance._4_4_;
}

Assistant:

int amqpvalue_get_sasl_response(AMQP_VALUE value, SASL_RESPONSE_HANDLE* sasl_response_handle)
{
    int result;
    SASL_RESPONSE_INSTANCE* sasl_response_instance = (SASL_RESPONSE_INSTANCE*)sasl_response_create_internal();
    *sasl_response_handle = sasl_response_instance;
    if (*sasl_response_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            sasl_response_destroy(*sasl_response_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* response */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            {
                                sasl_response_destroy(*sasl_response_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                sasl_response_destroy(*sasl_response_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                amqp_binary response;
                                if (amqpvalue_get_binary(item_value, &response) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    sasl_response_destroy(*sasl_response_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }

                    sasl_response_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}